

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1interval.cc
# Opt level: O2

double __thiscall S1Interval::Project(S1Interval *this,double p)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  double p_00;
  double dVar8;
  double dVar9;
  S2LogMessage local_18;
  
  dVar1 = (this->bounds_).c_[0];
  dVar2 = (this->bounds_).c_[1];
  if ((((dVar1 != 3.141592653589793) || (NAN(dVar1))) || (dVar2 != -3.141592653589793)) ||
     (NAN(dVar2))) {
    if (ABS(p) <= 3.141592653589793) {
      p_00 = (double)(~-(ulong)(p == -3.141592653589793) & (ulong)p |
                     -(ulong)(p == -3.141592653589793) & 0x400921fb54442d18);
      bVar5 = FastContains(this,p_00);
      if ((!bVar5) &&
         (dVar9 = p_00 + 3.141592653589793, dVar3 = dVar1 - p_00, dVar4 = p_00 - dVar2,
         dVar8 = p_00 + -3.141592653589793, uVar6 = -(ulong)(dVar3 < 0.0),
         uVar7 = -(ulong)(dVar4 < 0.0), p_00 = dVar1,
         (double)(~uVar7 & (ulong)dVar4 | (ulong)(dVar9 - (dVar2 + -3.141592653589793)) & uVar7) <=
         (double)(~uVar6 & (ulong)dVar3 | (ulong)((dVar1 + 3.141592653589793) - dVar8) & uVar6))) {
        p_00 = dVar2;
      }
      return p_00;
    }
    S2LogMessage::S2LogMessage
              (&local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.cc"
               ,0xbb,kFatal,(ostream *)&std::cerr);
    std::operator<<(local_18.stream_,"Check failed: (fabs(p)) <= (3.14159265358979323846) ");
  }
  else {
    S2LogMessage::S2LogMessage
              (&local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.cc"
               ,0xba,kFatal,(ostream *)&std::cerr);
    std::operator<<(local_18.stream_,"Check failed: !is_empty() ");
  }
  abort();
}

Assistant:

bool S1Interval::Contains(const S1Interval& y) const {
  // It might be helpful to compare the structure of these tests to
  // the simpler Contains(double) method above.

  if (is_inverted()) {
    if (y.is_inverted()) return y.lo() >= lo() && y.hi() <= hi();
    return (y.lo() >= lo() || y.hi() <= hi()) && !is_empty();
  } else {
    if (y.is_inverted()) return is_full() || y.is_empty();
    return y.lo() >= lo() && y.hi() <= hi();
  }
}